

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O0

uint32_t zhash_str_hash(void *_a)

{
  uint32_t local_1c;
  char *pcStack_18;
  int32_t hash;
  char *a;
  void *_a_local;
  
  if (_a != (void *)0x0) {
    pcStack_18 = *_a;
    local_1c = 0;
    for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
      local_1c = (int)*pcStack_18 + local_1c * 0x80 + ((int)local_1c >> 0x17);
    }
    return local_1c;
  }
  __assert_fail("_a != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zhash.c"
                ,0x219,"uint32_t zhash_str_hash(const void *)");
}

Assistant:

uint32_t zhash_str_hash(const void *_a)
{
    assert(_a != NULL);

    char *a = * (char**)_a;

    int32_t hash = 0;
    while (*a != 0) {
        hash = (hash << 7) + (hash >> 23);
        hash += *a;
        a++;
    }

    return (uint32_t) hash;
}